

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

QRectF * __thiscall
QTextDocumentLayoutPrivate::layoutFrame
          (QRectF *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextFrame *f,
          int layoutFrom,int layoutTo,QFixed frameWidth,QFixed frameHeight,QFixed parentY)

{
  int *piVar1;
  QFixed QVar2;
  Iterator it;
  Data *pDVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QFixed QVar9;
  QTextFrameLayoutData *data;
  long lVar10;
  QTextFrame *pQVar11;
  QTextFrameLayoutData *pQVar12;
  QTextTable *table;
  QTextTableData *td;
  int iVar13;
  char *pcVar14;
  int iVar15;
  undefined1 *puVar16;
  long in_FS_OFFSET;
  bool bVar17;
  qreal qVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QSizeF QVar22;
  bool local_14d;
  QList<QTextFrame_*> local_128;
  QRectF local_108;
  undefined1 local_e8 [16];
  QTextFrame *local_d8;
  undefined1 *puStack_d0;
  QTextLayoutStruct local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcLayout();
  if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_c8.frame._0_4_ = 2;
    local_c8.frame._4_4_ = 0;
    local_c8.x_left.val = 0;
    local_c8.x_right.val = 0;
    local_c8.frameY.val = 0;
    local_c8.y.val = 0;
    local_c8.contentsWidth.val = (int)QtPrivateLogging::lcLayout::category.name;
    local_c8.minimumWidth.val = (int)((ulong)QtPrivateLogging::lcLayout::category.name >> 0x20);
    uVar4 = QTextFrame::firstPosition(f);
    uVar5 = QTextFrame::lastPosition(f);
    QTextFrame::parentFrame(f);
    QMessageLogger::debug
              ((char *)&local_c8,"layoutFrame (%d--%d), parent=%p",(ulong)uVar4,(ulong)uVar5);
  }
  data = QTextFrame::layoutData(f);
  if (data == (QTextFrameLayoutData *)0x0) {
    lVar10 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar10 == 0) {
      data = (QTextFrameLayoutData *)operator_new(0x78);
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      data = (QTextFrameLayoutData *)operator_new(0x160);
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
      data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      memset(data + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(f,data);
  }
  local_c8.frame._0_4_ = 0xaaaaaaaa;
  local_c8.frame._4_4_ = 0xaaaaaaaa;
  local_c8.x_left.val = -0x55555556;
  local_c8.x_right.val = -0x55555556;
  QTextFrame::frameFormat((QTextFrame *)&local_c8);
  qVar18 = QTextFrameFormat::topMargin((QTextFrameFormat *)&local_c8);
  qVar18 = scaleToDevice(this,qVar18);
  uVar4 = (int)(qVar18 * 64.0) + 0x20U & 0xffffffc0;
  bVar17 = uVar4 != *(uint *)&data[3]._vptr_QTextFrameLayoutData;
  if (bVar17) {
    *(uint *)&data[3]._vptr_QTextFrameLayoutData = uVar4;
  }
  qVar18 = QTextFrameFormat::bottomMargin((QTextFrameFormat *)&local_c8);
  qVar18 = scaleToDevice(this,qVar18);
  uVar4 = (int)(qVar18 * 64.0) + 0x20U & 0xffffffc0;
  local_14d = uVar4 != *(uint *)((long)&data[3]._vptr_QTextFrameLayoutData + 4);
  if (local_14d) {
    *(uint *)((long)&data[3]._vptr_QTextFrameLayoutData + 4) = uVar4;
  }
  local_14d = local_14d || bVar17;
  qVar18 = QTextFrameFormat::leftMargin((QTextFrameFormat *)&local_c8);
  qVar18 = scaleToDevice(this,qVar18);
  *(uint *)&data[4]._vptr_QTextFrameLayoutData = (int)(qVar18 * 64.0) + 0x20U & 0xffffffc0;
  qVar18 = QTextFrameFormat::rightMargin((QTextFrameFormat *)&local_c8);
  qVar18 = scaleToDevice(this,qVar18);
  *(uint *)((long)&data[4]._vptr_QTextFrameLayoutData + 4) =
       (int)(qVar18 * 64.0) + 0x20U & 0xffffffc0;
  qVar18 = QTextFormat::doubleProperty((QTextFormat *)&local_c8,0x4000);
  qVar18 = scaleToDevice(this,qVar18);
  uVar4 = (int)(qVar18 * 64.0) + 0x20U & 0xffffffc0;
  if (uVar4 != *(uint *)&data[5]._vptr_QTextFrameLayoutData) {
    *(uint *)&data[5]._vptr_QTextFrameLayoutData = uVar4;
    local_14d = true;
  }
  qVar18 = QTextFormat::doubleProperty((QTextFormat *)&local_c8,0x4002);
  qVar18 = scaleToDevice(this,qVar18);
  uVar4 = (int)(qVar18 * 64.0) + 0x20U & 0xffffffc0;
  if (uVar4 != *(uint *)((long)&data[5]._vptr_QTextFrameLayoutData + 4)) {
    *(uint *)((long)&data[5]._vptr_QTextFrameLayoutData + 4) = uVar4;
    local_14d = true;
  }
  pQVar11 = QTextFrame::parentFrame(f);
  if (pQVar11 == (QTextFrame *)0x0) {
    pQVar12 = (QTextFrameLayoutData *)0x0;
  }
  else {
    pQVar12 = QTextFrame::layoutData(pQVar11);
    if (pQVar12 == (QTextFrameLayoutData *)0x0) {
      lVar10 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
      if (lVar10 == 0) {
        pQVar12 = (QTextFrameLayoutData *)operator_new(0x78);
        pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
        pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
        pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
        pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      }
      else {
        pQVar12 = (QTextFrameLayoutData *)operator_new(0x160);
        pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
        pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
        pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
        pQVar12[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        pQVar12[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        memset(pQVar12 + 0x11,0,0xc0);
      }
      QTextFrame::setLayoutData(pQVar11,pQVar12);
    }
  }
  if (pQVar11 == (QTextFrame *)0x0) {
    iVar6 = (int)data[5]._vptr_QTextFrameLayoutData;
    iVar15 = (int)((ulong)data[5]._vptr_QTextFrameLayoutData >> 0x20);
    *(ulong *)((long)&data[7]._vptr_QTextFrameLayoutData + 4) =
         CONCAT44((int)((ulong)data[3]._vptr_QTextFrameLayoutData >> 0x20) + iVar15 + iVar6,
                  (int)data[3]._vptr_QTextFrameLayoutData + iVar6 + iVar15);
  }
  else {
    iVar6 = *(int *)&data[5]._vptr_QTextFrameLayoutData +
            *(int *)&data[3]._vptr_QTextFrameLayoutData +
            *(int *)((long)&data[5]._vptr_QTextFrameLayoutData + 4);
    *(int *)((long)&data[7]._vptr_QTextFrameLayoutData + 4) =
         *(int *)((long)&pQVar12[7]._vptr_QTextFrameLayoutData + 4) + iVar6;
    *(int *)&data[8]._vptr_QTextFrameLayoutData =
         iVar6 + *(int *)&pQVar12[8]._vptr_QTextFrameLayoutData;
    lVar10 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar10 != 0) {
      piVar1 = (int *)((long)&data[7]._vptr_QTextFrameLayoutData + 4);
      *piVar1 = *piVar1 + *(int *)&pQVar12[0xf]._vptr_QTextFrameLayoutData +
                          *(int *)&pQVar12[5]._vptr_QTextFrameLayoutData +
                          *(int *)((long)&pQVar12[0xf]._vptr_QTextFrameLayoutData + 4);
      *(int *)&data[8]._vptr_QTextFrameLayoutData =
           *(int *)&data[8]._vptr_QTextFrameLayoutData +
           *(int *)&pQVar12[0xf]._vptr_QTextFrameLayoutData +
           *(int *)&pQVar12[5]._vptr_QTextFrameLayoutData +
           *(int *)((long)&pQVar12[0xf]._vptr_QTextFrameLayoutData + 4);
    }
  }
  iVar6 = *(int *)&data[4]._vptr_QTextFrameLayoutData;
  iVar15 = *(int *)&data[5]._vptr_QTextFrameLayoutData +
           *(int *)((long)&data[5]._vptr_QTextFrameLayoutData + 4);
  if (frameHeight.val != -0x40) {
    frameHeight.val =
         (iVar15 * -2 + frameHeight.val) -
         (*(int *)&data[3]._vptr_QTextFrameLayoutData +
         *(int *)((long)&data[3]._vptr_QTextFrameLayoutData + 4));
  }
  iVar13 = *(int *)((long)&data[4]._vptr_QTextFrameLayoutData + 4);
  *(int *)((long)&data[6]._vptr_QTextFrameLayoutData + 4) = frameHeight.val;
  QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
  iVar7 = QTextFrame::firstPosition(f);
  iVar8 = QTextFrame::lastPosition(f);
  if (iVar8 < iVar7) {
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
    __return_storage_ptr__->xp = 0.0;
    __return_storage_ptr__->yp = 0.0;
  }
  else {
    iVar6 = (frameWidth.val + iVar15 * -2) - (iVar6 + iVar13);
    table = (QTextTable *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    *(int *)&data[6]._vptr_QTextFrameLayoutData = iVar6;
    if (table == (QTextTable *)0x0) {
      memcpy(&local_c8,&DAT_006bc7b0,0x90);
      local_c8.pendingFloats.d.d = (Data *)0x0;
      local_c8.pendingFloats.d.ptr = (QTextFrame **)0x0;
      local_c8.pendingFloats.d.size = 0;
      local_c8.pageHeight.val = 0;
      local_c8.pageBottom.val = 0;
      local_c8.pageTopMargin.val = 0;
      local_c8.pageBottomMargin.val = 0;
      local_c8.updateRectForFloats.xp = 0.0;
      local_c8.updateRectForFloats.yp = 0.0;
      local_c8.updateRectForFloats.w = 0.0;
      local_c8.updateRectForFloats.h = 0.0;
      iVar15 = *(int *)((long)&data[5]._vptr_QTextFrameLayoutData + 4) +
               *(int *)&data[5]._vptr_QTextFrameLayoutData;
      local_c8.x_left.val = *(int *)&data[4]._vptr_QTextFrameLayoutData + iVar15;
      local_c8.x_right.val = local_c8.x_left.val + iVar6;
      local_c8.y.val = iVar15 + *(int *)&data[3]._vptr_QTextFrameLayoutData;
      local_c8.frameY.val = parentY.val + *(int *)((long)&data[1]._vptr_QTextFrameLayoutData + 4);
      local_c8.contentsWidth.val = 0;
      local_c8.minimumWidth.val = 0;
      local_c8.maximumWidth.val = 0x1fffffc0;
      local_c8.fullLayout = true;
      if (!local_14d) {
        local_c8.fullLayout = *(int *)&data[7]._vptr_QTextFrameLayoutData != iVar6;
      }
      local_c8.updateRect.xp = 0.0;
      local_c8.updateRect.yp = 0.0;
      local_c8.updateRect.w = 2147483647.0;
      local_c8.updateRect.h = 2147483647.0;
      local_c8.frame = f;
      QtPrivateLogging::lcLayout();
      if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base.
                 _M_i & 1) != 0) {
        local_108.xp._0_4_ = 2;
        local_108.xp._4_4_ = 0;
        local_108.yp._0_4_ = 0;
        local_108.yp._4_4_ = 0;
        local_108.w._0_4_ = 0;
        local_108.w._4_4_ = 0;
        local_108.h = (qreal)QtPrivateLogging::lcLayout::category.name;
        QMessageLogger::debug();
        pDVar3 = local_128.d.d;
        QVar19.m_data = (storage_type *)0x14;
        QVar19.m_size = (qsizetype)local_e8;
        QString::fromUtf8(QVar19);
        QTextStream::operator<<((QTextStream *)pDVar3,(QString *)local_e8);
        if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,(double)local_c8.x_left.val * 0.015625)
        ;
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar3 = local_128.d.d;
        QVar20.m_data = (storage_type *)0x7;
        QVar20.m_size = (qsizetype)local_e8;
        QString::fromUtf8(QVar20);
        QTextStream::operator<<((QTextStream *)pDVar3,(QString *)local_e8);
        if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        QTextStream::operator<<
                  ((QTextStream *)local_128.d.d,(double)local_c8.x_right.val * 0.015625);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pDVar3 = local_128.d.d;
        QVar21.m_data = (storage_type *)0xa;
        QVar21.m_size = (qsizetype)local_e8;
        QString::fromUtf8(QVar21);
        QTextStream::operator<<((QTextStream *)pDVar3,(QString *)local_e8);
        if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
          }
        }
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        pcVar14 = "false";
        if (local_c8.fullLayout != false) {
          pcVar14 = "true";
        }
        QTextStream::operator<<((QTextStream *)local_128.d.d,pcVar14);
        if ((char)local_128.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_128.d.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_128);
      }
      *(int *)&data[7]._vptr_QTextFrameLayoutData = iVar6;
      QVar22 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
      uVar4 = (uint)(QVar22.ht * 64.0);
      local_c8.pageHeight.val = 0x1fffffc0;
      if (-1 < (int)uVar4) {
        local_c8.pageHeight.val = uVar4;
      }
      if (local_c8.pageHeight.val == 0) {
        iVar15 = 1;
      }
      else {
        QVar9.val = -local_c8.frameY.val;
        if (0 < local_c8.frameY.val) {
          QVar9.val = local_c8.frameY.val;
        }
        QVar2.val = -local_c8.pageHeight.val;
        if (0 < local_c8.pageHeight.val) {
          QVar2.val = local_c8.pageHeight.val;
        }
        iVar13 = (int)(((ulong)((uint)QVar2.val >> 1) + (ulong)(uint)QVar9.val * 0x40) /
                      (ulong)(uint)QVar2.val);
        iVar15 = -iVar13;
        if (-1 < (local_c8.frameY.val ^ local_c8.pageHeight.val)) {
          iVar15 = iVar13;
        }
        iVar15 = (iVar15 >> 6) + 1;
      }
      local_c8._72_8_ = *(undefined8 *)((long)&data[7]._vptr_QTextFrameLayoutData + 4);
      local_c8.pageBottom.val =
           iVar15 * local_c8.pageHeight.val - *(int *)&data[8]._vptr_QTextFrameLayoutData;
      pQVar11 = QTextFrame::parentFrame(f);
      if (pQVar11 == (QTextFrame *)0x0) {
        this->idealWidth = 0.0;
      }
      local_d8 = (QTextFrame *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::begin((iterator *)local_e8,f);
      iVar15 = 0;
      it.b = local_e8._8_4_;
      it.e = local_e8._12_4_;
      it.f = (QTextFrame *)local_e8._0_8_;
      it.cf = local_d8;
      it._24_8_ = puStack_d0;
      layoutFlow(this,it,&local_c8,layoutFrom,layoutTo,(QFixed)0x0);
      local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::childFrames(&local_128,f);
      if ((undefined1 *)local_128.d.size != (undefined1 *)0x0) {
        puVar16 = (undefined1 *)0x0;
        iVar13 = 0;
        do {
          pQVar11 = local_128.d.ptr[(long)puVar16];
          pQVar12 = QTextFrame::layoutData(pQVar11);
          if (pQVar12 == (QTextFrameLayoutData *)0x0) {
            lVar10 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
            if (lVar10 == 0) {
              pQVar12 = (QTextFrameLayoutData *)operator_new(0x78);
              pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
              pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
              pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
              pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            }
            else {
              pQVar12 = (QTextFrameLayoutData *)operator_new(0x160);
              pQVar12[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined4 *)&pQVar12[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
              pQVar12[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              *(undefined2 *)&pQVar12[0xb]._vptr_QTextFrameLayoutData = 0x101;
              pQVar12[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
              pQVar12[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              pQVar12[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
              memset(pQVar12 + 0x11,0,0xc0);
            }
            QTextFrame::setLayoutData(pQVar11,pQVar12);
          }
          iVar15 = *(int *)&pQVar12[2]._vptr_QTextFrameLayoutData;
          if (*(int *)&pQVar12[2]._vptr_QTextFrameLayoutData < iVar13) {
            iVar15 = iVar13;
          }
          puVar16 = puVar16 + 1;
          iVar13 = iVar15;
        } while (puVar16 < (ulong)local_128.d.size);
      }
      iVar13 = (*(int *)&data[5]._vptr_QTextFrameLayoutData +
               *(int *)((long)&data[5]._vptr_QTextFrameLayoutData + 4)) * 2 +
               *(int *)&data[4]._vptr_QTextFrameLayoutData +
               *(int *)((long)&data[4]._vptr_QTextFrameLayoutData + 4);
      pQVar11 = QTextFrame::parentFrame(f);
      if (pQVar11 == (QTextFrame *)0x0) {
        QVar9.val = local_c8.contentsWidth.val;
        if (local_c8.contentsWidth.val < iVar15) {
          QVar9.val = iVar15;
        }
        this->idealWidth = (double)iVar13 * 0.015625 + (double)QVar9.val * 0.015625;
      }
      QVar9.val = local_c8.contentsWidth.val;
      if (local_c8.contentsWidth.val < iVar15) {
        QVar9.val = iVar15;
      }
      if (QVar9.val < iVar6) {
        QVar9.val = iVar6;
      }
      if (0 < iVar6) {
        iVar6 = QVar9.val;
      }
      *(int *)&data[6]._vptr_QTextFrameLayoutData = iVar6;
      *(ulong *)((long)&data[8]._vptr_QTextFrameLayoutData + 4) =
           CONCAT44(local_c8.maximumWidth.val,local_c8.minimumWidth.val);
      iVar6 = *(int *)((long)&data[6]._vptr_QTextFrameLayoutData + 4);
      if (iVar6 == -0x40) {
        iVar6 = local_c8.y.val + *(int *)&data[5]._vptr_QTextFrameLayoutData +
                *(int *)((long)&data[5]._vptr_QTextFrameLayoutData + 4);
      }
      else {
        iVar6 = iVar6 + *(int *)&data[3]._vptr_QTextFrameLayoutData +
                (*(int *)&data[5]._vptr_QTextFrameLayoutData +
                *(int *)((long)&data[5]._vptr_QTextFrameLayoutData + 4)) * 2;
      }
      *(int *)((long)&data[2]._vptr_QTextFrameLayoutData + 4) =
           iVar6 + *(int *)((long)&data[3]._vptr_QTextFrameLayoutData + 4);
      *(int *)&data[2]._vptr_QTextFrameLayoutData = QVar9.val + iVar13;
      *(undefined1 *)&data[0xb]._vptr_QTextFrameLayoutData = 0;
      if ((0.0 < local_c8.updateRectForFloats.w) && (0.0 < local_c8.updateRectForFloats.h)) {
        QRectF::operator|(&local_108,&local_c8.updateRect);
        local_c8.updateRect.xp = (qreal)CONCAT44(local_108.xp._4_4_,local_108.xp._0_4_);
        local_c8.updateRect.yp = (qreal)CONCAT44(local_108.yp._4_4_,local_108.yp._0_4_);
        local_c8.updateRect.w = (qreal)CONCAT44(local_108.w._4_4_,local_108.w._0_4_);
        local_c8.updateRect.h = local_108.h;
      }
      __return_storage_ptr__->w = local_c8.updateRect.w;
      __return_storage_ptr__->h = local_c8.updateRect.h;
      __return_storage_ptr__->xp = local_c8.updateRect.xp;
      __return_storage_ptr__->yp = local_c8.updateRect.yp;
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,8,0x10);
        }
      }
      if (&(local_c8.pendingFloats.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.pendingFloats.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_c8.pendingFloats.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.pendingFloats.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_c8.pendingFloats.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    else {
      layoutTable(__return_storage_ptr__,this,table,layoutFrom,layoutTo,parentY);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QTextDocumentLayoutPrivate::layoutFrame(QTextFrame *f, int layoutFrom, int layoutTo, QFixed frameWidth, QFixed frameHeight, QFixed parentY)
{
    qCDebug(lcLayout, "layoutFrame (%d--%d), parent=%p", f->firstPosition(), f->lastPosition(), f->parentFrame());
    Q_ASSERT(data(f)->sizeDirty);

    QTextFrameData *fd = data(f);
    QFixed newContentsWidth;

    bool fullLayout = false;
    {
        QTextFrameFormat fformat = f->frameFormat();
        // set sizes of this frame from the format
        QFixed tm = QFixed::fromReal(scaleToDevice(fformat.topMargin())).round();
        if (tm != fd->topMargin) {
            fd->topMargin = tm;
            fullLayout = true;
        }
        QFixed bm = QFixed::fromReal(scaleToDevice(fformat.bottomMargin())).round();
        if (bm != fd->bottomMargin) {
            fd->bottomMargin = bm;
            fullLayout = true;
        }
        fd->leftMargin = QFixed::fromReal(scaleToDevice(fformat.leftMargin())).round();
        fd->rightMargin = QFixed::fromReal(scaleToDevice(fformat.rightMargin())).round();
        QFixed b = QFixed::fromReal(scaleToDevice(fformat.border())).round();
        if (b != fd->border) {
            fd->border = b;
            fullLayout = true;
        }
        QFixed p = QFixed::fromReal(scaleToDevice(fformat.padding())).round();
        if (p != fd->padding) {
            fd->padding = p;
            fullLayout = true;
        }

        QTextFrame *parent = f->parentFrame();
        const QTextFrameData *pd = parent ? data(parent) : nullptr;

        // accumulate top and bottom margins
        if (parent) {
            fd->effectiveTopMargin = pd->effectiveTopMargin + fd->topMargin + fd->border + fd->padding;
            fd->effectiveBottomMargin = pd->effectiveBottomMargin + fd->topMargin + fd->border + fd->padding;

            if (qobject_cast<QTextTable *>(parent)) {
                const QTextTableData *td = static_cast<const QTextTableData *>(pd);
                fd->effectiveTopMargin += td->cellSpacing + td->border + td->cellPadding;
                fd->effectiveBottomMargin += td->cellSpacing + td->border + td->cellPadding;
            }
        } else {
            fd->effectiveTopMargin = fd->topMargin + fd->border + fd->padding;
            fd->effectiveBottomMargin = fd->bottomMargin + fd->border + fd->padding;
        }

        newContentsWidth = frameWidth - 2*(fd->border + fd->padding)
                           - fd->leftMargin - fd->rightMargin;

        if (frameHeight != -1) {
            fd->contentsHeight = frameHeight - 2*(fd->border + fd->padding)
                                 - fd->topMargin - fd->bottomMargin;
        } else {
            fd->contentsHeight = frameHeight;
        }
    }

    if (isFrameFromInlineObject(f)) {
        // never reached, handled in resizeInlineObject/positionFloat instead
        return QRectF();
    }

    if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
        fd->contentsWidth = newContentsWidth;
        return layoutTable(table, layoutFrom, layoutTo, parentY);
    }

    // set fd->contentsWidth temporarily, so that layoutFrame for the children
    // picks the right width. We'll initialize it properly at the end of this
    // function.
    fd->contentsWidth = newContentsWidth;

    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = f;
    layoutStruct.x_left = fd->leftMargin + fd->border + fd->padding;
    layoutStruct.x_right = layoutStruct.x_left + newContentsWidth;
    layoutStruct.y = fd->topMargin + fd->border + fd->padding;
    layoutStruct.frameY = parentY + fd->position.y;
    layoutStruct.contentsWidth = 0;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.fullLayout = fullLayout || (fd->oldContentsWidth != newContentsWidth);
    layoutStruct.updateRect = QRectF(QPointF(0, 0), QSizeF(qreal(INT_MAX), qreal(INT_MAX)));
    qCDebug(lcLayout) << "layoutStruct: x_left" << layoutStruct.x_left << "x_right" << layoutStruct.x_right
                      << "fullLayout" << layoutStruct.fullLayout;
    fd->oldContentsWidth = newContentsWidth;

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0)
        layoutStruct.pageHeight = QFIXED_MAX;

    const int currentPage = layoutStruct.pageHeight == 0 ? 0 : (layoutStruct.frameY / layoutStruct.pageHeight).truncate();
    layoutStruct.pageTopMargin = fd->effectiveTopMargin;
    layoutStruct.pageBottomMargin = fd->effectiveBottomMargin;
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    if (!f->parentFrame())
        idealWidth = 0; // reset

    QTextFrame::Iterator it = f->begin();
    layoutFlow(it, &layoutStruct, layoutFrom, layoutTo);

    QFixed maxChildFrameWidth = 0;
    QList<QTextFrame *> children = f->childFrames();
    for (int i = 0; i < children.size(); ++i) {
        QTextFrame *c = children.at(i);
        QTextFrameData *cd = data(c);
        maxChildFrameWidth = qMax(maxChildFrameWidth, cd->size.width);
    }

    const QFixed marginWidth = 2*(fd->border + fd->padding) + fd->leftMargin + fd->rightMargin;
    if (!f->parentFrame()) {
        idealWidth = qMax(maxChildFrameWidth, layoutStruct.contentsWidth).toReal();
        idealWidth += marginWidth.toReal();
    }

    QFixed actualWidth = qMax(newContentsWidth, qMax(maxChildFrameWidth, layoutStruct.contentsWidth));
    fd->contentsWidth = actualWidth;
    if (newContentsWidth <= 0) { // nowrap layout?
        fd->contentsWidth = newContentsWidth;
    }

    fd->minimumWidth = layoutStruct.minimumWidth;
    fd->maximumWidth = layoutStruct.maximumWidth;

    fd->size.height = fd->contentsHeight == -1
                 ? layoutStruct.y + fd->border + fd->padding + fd->bottomMargin
                 : fd->contentsHeight + 2*(fd->border + fd->padding) + fd->topMargin + fd->bottomMargin;
    fd->size.width = actualWidth + marginWidth;
    fd->sizeDirty = false;
    if (layoutStruct.updateRectForFloats.isValid())
        layoutStruct.updateRect |= layoutStruct.updateRectForFloats;
    return layoutStruct.updateRect;
}